

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O1

void ff_cast(flexfloat_t *obj,flexfloat_t *source,flexfloat_desc_t desc)

{
  fp_t fVar1;
  _Bool _Var2;
  ulong uVar3;
  double dVar4;
  ulong uVar5;
  uint_t uVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint8_t uVar13;
  ulong uVar14;
  
  obj->value = source->value;
  (obj->desc).exp_bits = desc.exp_bits;
  (obj->desc).frac_bits = desc.frac_bits;
  if (((source->desc).exp_bits == desc.exp_bits) && (desc.frac_bits == (source->desc).frac_bits)) {
    return;
  }
  fVar1 = obj->value;
  uVar3 = flexfloat_exp(obj);
  if (((obj->desc).exp_bits == '\v') && ((obj->desc).frac_bits == '4')) {
    return;
  }
  uVar10 = 0x7ff;
  if ((uVar3 == 0x7ff) || (uVar10 = uVar3, (obj->desc).frac_bits == '4')) goto LAB_0012838c;
  iVar9 = fegetround();
  if (iVar9 == 0x800) {
    _Var2 = flexfloat_round_bit(obj,uVar3);
    if (_Var2) {
      if (-1 < (long)fVar1) {
LAB_00128361:
        dVar4 = (double)flexfloat_rounding_value(obj,uVar3,SUB81((ulong)fVar1 >> 0x3f,0));
        obj->value = dVar4 + obj->value;
      }
    }
    else {
      _Var2 = flexfloat_sticky_bit(obj,uVar3);
      if (_Var2 && -1 < (long)fVar1) goto LAB_00128361;
    }
  }
  else if (iVar9 == 0x400) {
    _Var2 = flexfloat_round_bit(obj,uVar3);
    if (_Var2) {
      if ((long)fVar1 < 0) goto LAB_00128361;
    }
    else {
      _Var2 = flexfloat_sticky_bit(obj,uVar3);
      if (_Var2 && (long)fVar1 < 0) goto LAB_00128361;
    }
  }
  else if ((iVar9 == 0) && (_Var2 = flexfloat_nearest_rounding(obj,uVar3), _Var2))
  goto LAB_00128361;
  uVar10 = flexfloat_exp(obj);
LAB_0012838c:
  bVar7 = (obj->desc).exp_bits;
  uVar11 = -1L << (bVar7 & 0x3f);
  bVar8 = (obj->desc).frac_bits;
  uVar3 = ((ulong)obj->value & 0xfffffffffffff) >> (0x34 - bVar8 & 0x3f);
  uVar13 = (obj->desc).frac_bits;
  if (((ulong)obj->value & 0x7ff0000000000000) == 0) {
    uVar10 = (ulong)fVar1 & 0x8000000000000000;
    lVar12 = uVar3 << (0x34 - uVar13 & 0x3f);
  }
  else {
    if ((long)uVar10 < 1) {
      uVar6 = flexfloat_denorm_frac(obj,uVar10);
      if (uVar6 == 0) {
        obj->value = (fp_t)((ulong)fVar1 & 0x8000000000000000);
      }
      else if (bVar8 < 0x34) {
        iVar9 = 1 - (int)uVar10;
        bVar8 = (byte)iVar9;
        uVar3 = (uVar3 >> (bVar8 & 0x3f)) << (bVar8 & 0x3f);
        if (0x33 < iVar9) {
          uVar3 = 0;
        }
      }
      uVar14 = uVar10;
      if (uVar6 == 0) {
        return;
      }
    }
    else {
      uVar5 = ~uVar11;
      uVar14 = uVar5;
      if ((uVar10 != 0x7ff) && (uVar14 = uVar10, (long)uVar5 <= (long)uVar10)) {
        uVar3 = 0;
        uVar14 = uVar5;
      }
    }
    uVar10 = ((ulong)((int)(-1L << (bVar7 - 1 & 0x3f)) + (int)uVar14 + 1) << 0x34) +
             0x3ff0000000000000;
    if ((uVar11 ^ uVar14) == 0xffffffffffffffff) {
      uVar10 = 0x7ff0000000000000;
    }
    lVar12 = (uVar3 << (0x34 - uVar13 & 0x3f)) + ((ulong)fVar1 & 0x8000000000000000);
  }
  obj->value = (fp_t)(lVar12 + uVar10);
  return;
}

Assistant:

INLINE void ff_cast(flexfloat_t *obj, const flexfloat_t *source, flexfloat_desc_t desc ) {
    obj->value = source->value;
    #ifdef FLEXFLOAT_TRACKING
    obj->exact_value = source->exact_value;
    obj->tracking_fn = 0;
    obj->tracking_arg = 0;
    #endif
    obj->desc  = desc;
    if(desc.exp_bits != source->desc.exp_bits || desc.frac_bits != source->desc.frac_bits)
        flexfloat_sanitize(obj);
    #ifdef FLEXFLOAT_STATS
    if(StatsEnabled) getCastStats(source->desc, desc)->total += 1;
    #endif
}